

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdcore_logger.h
# Opt level: O0

void cfd::core::logger::log<std::__cxx11::string&,cfd::core::NetType&,cfd::core::NetType&>
               (CfdSourceLocation *source,CfdLogLevel lvl,char *fmt,
               basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *args,
               anon_enum_32 *args_1,anon_enum_32 *args_2)

{
  bool bVar1;
  CfdLogLevel in_ESI;
  CfdSourceLocation *in_RDI;
  anon_union_8_2_de49483c_for_basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>_2
  in_R9;
  format_args args_00;
  string_view format_str;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> message;
  format_arg_store<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cfd::core::NetType,_cfd::core::NetType>
  *vargs;
  string *__return_storage_ptr__;
  remove_reference_t<cfd::core::NetType_&> *in_stack_fffffffffffffef8;
  remove_reference_t<std::__cxx11::basic_string<char>_&> *in_stack_ffffffffffffff00;
  char **in_stack_ffffffffffffff08;
  undefined8 local_c0;
  CfdLogLevel local_b4;
  CfdSourceLocation *local_b0;
  basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
  local_a8;
  basic_string_view<char> local_98;
  value<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_> local_88 [3];
  value<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_> *local_58;
  undefined8 *local_38;
  string *local_30;
  value<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_> *local_28;
  basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
  *local_20;
  value<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_> *local_18;
  basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
  *local_10;
  value<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_> *local_8;
  
  local_b4 = in_ESI;
  local_b0 = in_RDI;
  bVar1 = IsEnableLogLevel(in_ESI);
  if (bVar1) {
    __return_storage_ptr__ = (string *)&stack0xffffffffffffff08;
    local_38 = &local_c0;
    local_30 = __return_storage_ptr__;
    ::fmt::v7::
    make_args_checked<std::__cxx11::string&,cfd::core::NetType&,cfd::core::NetType&,char_const*,char>
              (in_stack_ffffffffffffff08,in_stack_ffffffffffffff00,in_stack_fffffffffffffef8,
               (remove_reference_t<cfd::core::NetType_&> *)__return_storage_ptr__);
    local_58 = local_88;
    local_98 = ::fmt::v7::to_string_view<char,_0>((char *)*local_38);
    local_20 = &local_a8;
    local_28 = local_58;
    local_18 = local_58;
    local_8 = local_58;
    local_10 = local_20;
    ::fmt::v7::
    basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
    ::basic_format_args(local_20,0x22d,local_58);
    args_00.
    super_basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
    .field_1.values_ = in_R9.values_;
    args_00.
    super_basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
    .desc_ = (unsigned_long_long)local_a8.field_1.values_;
    format_str.size_ = local_a8.desc_;
    format_str.data_ = (char *)local_98.size_;
    ::fmt::v7::detail::vformat_abi_cxx11_
              (__return_storage_ptr__,(detail *)local_98.data_,format_str,args_00);
    WriteLog(local_b0,local_b4,__return_storage_ptr__);
    ::std::__cxx11::string::~string((string *)&stack0xffffffffffffff08);
  }
  return;
}

Assistant:

void log(
    const CfdSourceLocation &source, cfd::core::logger::CfdLogLevel lvl,
    const char *fmt, Args &&...args) {
  if (cfd::core::logger::IsEnableLogLevel(lvl)) {
    auto message = fmt::format(fmt, args...);
    // std::string message = fmt::format(std::locale::messages, fmt, args...);
    cfd::core::logger::WriteLog(source, lvl, message);
  }
}